

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

void pty_uxsel_setup(Pty *pty)

{
  Pty *pty_local;
  
  pty_uxsel_setup_fd(pty,pty->master_o);
  pty_uxsel_setup_fd(pty,pty->master_e);
  pty_uxsel_setup_fd(pty,pty->master_i);
  uxsel_set(pty_signal_pipe[0],1,pty_select_result);
  return;
}

Assistant:

static void pty_uxsel_setup(Pty *pty)
{
    /*
     * We potentially have three separate fds here, but on the other
     * hand, some of them might be the same (if they're a pty master).
     * So we can't just call uxsel_set(master_o, SELECT_R) and then
     * uxsel_set(master_i, SELECT_W), without the latter potentially
     * undoing the work of the former if master_o == master_i.
     *
     * Instead, here we call a single uxsel on each one of these fds
     * (if it exists at all), and for each one, check it against all
     * three to see which bits to set.
     */
    pty_uxsel_setup_fd(pty, pty->master_o);
    pty_uxsel_setup_fd(pty, pty->master_e);
    pty_uxsel_setup_fd(pty, pty->master_i);

    /*
     * In principle this only needs calling once for all pty
     * backend instances, but it's simplest just to call it every
     * time; uxsel won't mind.
     */
    uxsel_set(pty_signal_pipe[0], SELECT_R, pty_select_result);
}